

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

void __thiscall
QFileSystemModelPrivate::directoryChanged
          (QFileSystemModelPrivate *this,QString *directory,QStringList *files)

{
  int iVar1;
  QFileSystemNode *parentNode;
  iterator iVar2;
  iterator iVar3;
  pointer pQVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Data *pDVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parentNode = node(this,directory,false);
  pDVar8 = (parentNode->children).d;
  if ((pDVar8 == (Data *)0x0) || (pDVar8->size == 0)) goto LAB_006246fd;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  local_78.d = (files->d).d;
  local_78.ptr = (files->d).ptr;
  local_78.size = (files->d).size;
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar2 = QList<QString>::begin((QList<QString> *)&local_78);
  iVar3 = QList<QString>::end((QList<QString> *)&local_78);
  if (iVar2.i != iVar3.i) {
    uVar5 = ((long)iVar3.i - (long)iVar2.i >> 3) * -0x5555555555555555;
    lVar7 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::__introsort_loop<QList<QString>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QString>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i);
  }
  pDVar8 = (parentNode->children).d;
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
LAB_0062457c:
    uVar5 = 0;
  }
  else {
    if (pDVar8->spans->offsets[0] != 0xff) goto LAB_0062457c;
    uVar6 = 1;
    do {
      uVar5 = uVar6;
      if (pDVar8->numBuckets == uVar5) {
        pDVar8 = (Data *)0x0;
        uVar5 = 0;
        break;
      }
      uVar6 = uVar5 + 1;
    } while (pDVar8->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  }
  if (pDVar8 != (Data *)0x0 || uVar5 != 0) {
    do {
      iVar2 = QList<QString>::begin((QList<QString> *)&local_78);
      iVar3 = QList<QString>::end((QList<QString> *)&local_78);
      uVar6 = uVar5 >> 7;
      uVar9 = (uint)uVar5 & 0x7f;
      iVar2 = std::__lower_bound<QList<QString>::iterator,QString,__gnu_cxx::__ops::_Iter_less_val>
                        (iVar2.i,iVar3.i,
                         *(undefined8 *)
                          (pDVar8->spans[uVar6].entries[pDVar8->spans[uVar6].offsets[uVar9]].storage
                           .data + 0x18));
      iVar3 = QList<QString>::end((QList<QString> *)&local_78);
      if ((iVar2.i == iVar3.i) ||
         (lVar7 = *(long *)(pDVar8->spans[uVar6].entries[pDVar8->spans[uVar6].offsets[uVar9]].
                            storage.data + 0x18), QVar10.m_data = ((iVar2.i)->d).ptr,
         QVar10.m_size = ((iVar2.i)->d).size, QVar11.m_data = *(storage_type_conflict **)(lVar7 + 8)
         , QVar11.m_size = *(qsizetype *)(lVar7 + 0x10),
         iVar1 = QtPrivate::compareStrings(QVar11,QVar10,CaseSensitive), iVar1 < 0)) {
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_58,local_58.size,
                   *(QString **)
                    (pDVar8->spans[uVar6].entries[pDVar8->spans[uVar6].offsets[uVar9]].storage.data
                    + 0x18));
        QList<QString>::end((QList<QString> *)&local_58);
      }
      do {
        if (pDVar8->numBuckets - 1 == uVar5) {
          pDVar8 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar8->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while ((pDVar8 != (Data *)0x0) || (uVar5 != 0));
  }
  if (local_58.size != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      pQVar4 = QList<QString>::data((QList<QString> *)&local_58);
      removeNode(this,parentNode,(QString *)((long)&(pQVar4->d).d + lVar7));
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x18;
    } while (uVar5 < (ulong)local_58.size);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_006246fd:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileSystemModelPrivate::directoryChanged(const QString &directory, const QStringList &files)
{
    QFileSystemModelPrivate::QFileSystemNode *parentNode = node(directory, false);
    if (parentNode->children.size() == 0)
        return;
    QStringList toRemove;
    QStringList newFiles = files;
    std::sort(newFiles.begin(), newFiles.end());
    for (auto i = parentNode->children.constBegin(), cend = parentNode->children.constEnd(); i != cend; ++i) {
        QStringList::iterator iterator = std::lower_bound(newFiles.begin(), newFiles.end(), i.value()->fileName);
        if ((iterator == newFiles.end()) || (i.value()->fileName < *iterator))
            toRemove.append(i.value()->fileName);
    }
    for (int i = 0 ; i < toRemove.size() ; ++i )
        removeNode(parentNode, toRemove[i]);
}